

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-val.hpp
# Opt level: O2

Up __thiscall
yactfr::internal::
JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>
::_clone(JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>
         *this)

{
  _Alloc_hider _Var1;
  _func_int **in_RAX;
  long in_RSI;
  _Alloc_hider local_18;
  
  local_18._M_p = (pointer)in_RAX;
  std::
  make_unique<yactfr::internal::JsonScalarVal<std::__cxx11::string,(yactfr::internal::JsonValKind)5>const,std::__cxx11::string_const&,yactfr::TextLocation_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffe8,(TextLocation *)(in_RSI + 0x28));
  _Var1._M_p = local_18._M_p;
  local_18._M_p = (pointer)0x0;
  (this->super_JsonVal)._vptr_JsonVal = (_func_int **)_Var1._M_p;
  std::
  unique_ptr<const_yactfr::internal::JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>,_std::default_delete<const_yactfr::internal::JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>_>_>
  ::~unique_ptr((unique_ptr<const_yactfr::internal::JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>,_std::default_delete<const_yactfr::internal::JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>_>_>
                 *)&stack0xffffffffffffffe8);
  return (__uniq_ptr_data<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>,_true,_true>
            )this;
}

Assistant:

JsonVal::Up _clone() const override
    {
        return std::make_unique<const JsonScalarVal<ValT, KindV>>(this->_val(), this->loc());
    }